

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mtrand.c
# Opt level: O2

void mt_srand(uint seed)

{
  uint *puVar1;
  uint uVar2;
  uint uVar3;
  
  left = 0;
  uVar3 = seed | 1;
  puVar1 = state;
  state[0] = uVar3;
  for (uVar2 = 0x270; puVar1 = puVar1 + 1, 1 < uVar2; uVar2 = uVar2 - 1) {
    uVar3 = uVar3 * 0x10dcd;
    *puVar1 = uVar3;
  }
  return;
}

Assistant:

void mt_srand(unsigned int seed)
{
    /* We initialize state[0..(N-1)] via the generator
     *
     *   x_new = (69069 * x_old) mod 2^32
     *
     * from Line 15 of Table 1, p. 106, Sec. 3.3.4 of Knuth's
     * _The Art of Computer Programming_, Volume 2, 3rd ed. */
    int j;
    unsigned int x = (seed | 1) & 0xFFFFFFFF;
    unsigned int *s = state;

    left = 0;
    *s++ = x;
    for (j = N; j > 1; --j)
	 *s++ = (x*=69069U) & 0xFFFFFFFF;
}